

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O2

int cmd_help(char *arg)

{
  int iVar1;
  char *__s;
  char *__s1;
  COMMAND *pCVar2;
  COMMAND *pCVar3;
  
  __s = strdup(arg);
  strtok(__s," ");
  __s1 = strtok((char *)0x0," ");
  if (__s1 == (char *)0x0) {
LAB_00109616:
    fwrite("Available commands:\n",0x14,1,_stdout);
    for (pCVar2 = commands; pCVar2->name != (char *)0x0; pCVar2 = pCVar2 + 1) {
      if (pCVar2->helpstring != (char *)0x0) {
        fprintf(_stdout,"  %-15s %s\n");
      }
    }
  }
  else {
    pCVar2 = commands;
    do {
      pCVar3 = pCVar2;
      if (pCVar3->name == (char *)0x0) {
        printf("Unknown command \'%s\'\n",__s1);
        goto LAB_00109616;
      }
      iVar1 = strcmp(__s1,pCVar3->name);
      pCVar2 = pCVar3 + 1;
    } while (iVar1 != 0);
    if (pCVar3->help_func == (_func_void *)0x0) {
      puts(pCVar3->helpstring);
    }
    else {
      (*pCVar3->help_func)();
    }
  }
  free(__s);
  return 0;
}

Assistant:

int
cmd_help(const char *arg)
{
    int i;
    char *args = strdup(arg);
    char *cmd = NULL;

    strtok(args, " ");
    if ((cmd = strtok(NULL, " ")) == NULL) {

generic_help:
        fprintf(stdout, "Available commands:\n");

        for (i = 0; commands[i].name; i++) {
            if (commands[i].helpstring != NULL) {
                fprintf(stdout, "  %-15s %s\n", commands[i].name, commands[i].helpstring);
            }
        }
    } else {
        /* print specific help for the selected command */

        /* get the command of the specified name */
        for (i = 0; commands[i].name; i++) {
            if (strcmp(cmd, commands[i].name) == 0) {
                break;
            }
        }

        /* execute the command's help if any valid command specified */
        if (commands[i].name) {
            if (commands[i].help_func != NULL) {
                commands[i].help_func();
            } else {
                printf("%s\n", commands[i].helpstring);
            }
        } else {
            /* if unknown command specified, print the list of commands */
            printf("Unknown command \'%s\'\n", cmd);
            goto generic_help;
        }
    }

    free(args);
    return 0;
}